

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::LogParser::EndElement(LogParser *this,string *name)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  undefined1 local_70 [8];
  string new_path;
  allocator local_39;
  undefined1 local_38 [8];
  string orig_path;
  string *name_local;
  LogParser *this_local;
  
  orig_path.field_2._8_8_ = name;
  bVar1 = std::operator==(name,"logentry");
  if (bVar1) {
    DoRevisionSVN(this->SVN,&this->Rev,&this->Changes);
  }
  else {
    bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )orig_path.field_2._8_8_,"path"), !bVar1)) {
      bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)orig_path.field_2._8_8_,"author"), !bVar1)) {
        bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)orig_path.field_2._8_8_,"date"), !bVar1)) {
          bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
          if ((!bVar1) &&
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)orig_path.field_2._8_8_,"msg"), bVar1)) {
            pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
            std::vector<char,_std::allocator<char>_>::size(&this->CData);
            std::__cxx11::string::assign((char *)&(this->Rev).super_Revision.Log,(ulong)pvVar3);
          }
        }
        else {
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
          std::vector<char,_std::allocator<char>_>::size(&this->CData);
          std::__cxx11::string::assign((char *)&(this->Rev).super_Revision.Date,(ulong)pvVar3);
        }
      }
      else {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
        std::vector<char,_std::allocator<char>_>::size(&this->CData);
        std::__cxx11::string::assign((char *)&(this->Rev).super_Revision.Author,(ulong)pvVar3);
      }
    }
    else {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
      sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->CData);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_38,pvVar3,sVar2,&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      SVNInfo::BuildLocalPath((string *)local_70,this->SVNRepo,(string *)local_38);
      std::__cxx11::string::assign((string *)&(this->CurChange).Path);
      std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
                (&this->Changes,&this->CurChange);
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)local_38);
    }
  }
  std::vector<char,_std::allocator<char>_>::clear(&this->CData);
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "logentry") {
      this->SVN->DoRevisionSVN(this->Rev, this->Changes);
    } else if (!this->CData.empty() && name == "path") {
      std::string orig_path(&this->CData[0], this->CData.size());
      std::string new_path = SVNRepo.BuildLocalPath(orig_path);
      this->CurChange.Path.assign(new_path);
      this->Changes.push_back(this->CurChange);
    } else if (!this->CData.empty() && name == "author") {
      this->Rev.Author.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "date") {
      this->Rev.Date.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "msg") {
      this->Rev.Log.assign(&this->CData[0], this->CData.size());
    }
    this->CData.clear();
  }